

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdconntable.c
# Opt level: O0

int InsertInStdResConnTable(StdResConnTableEntry_t *elem)

{
  bool bVar1;
  uint uVar2;
  StdResConnTableEntry_t *local_28;
  StdResConnTableEntry_t *t;
  int rc;
  int h;
  int r;
  StdResConnTableEntry_t *elem_local;
  
  t._4_4_ = 1;
  uVar2 = HashInStdResTbl(elem->key);
  local_28 = StdResTblBucket[(int)uVar2];
  if (local_28 == (StdResConnTableEntry_t *)0x0) {
    elem->next = (_StdResConnTableEntry *)0x0;
    StdResTblBucket[(int)uVar2] = elem;
  }
  else {
    rc = strcmp(elem->key,local_28->key);
    if (rc < 1) {
      if (-1 < rc) {
        fprintf(_stderr,
                "ERROR duplicate key: InsertInStdResConnTable(\"%s\", \"%s\") - old(\"%s\" @%d)\n",
                elem->key,elem->value,local_28->value,(ulong)uVar2);
      }
      else {
        elem->next = local_28;
        StdResTblBucket[(int)uVar2] = elem;
      }
      t._4_4_ = (uint)(-1 >= rc);
    }
    else {
      while( true ) {
        bVar1 = false;
        if (local_28->next != (_StdResConnTableEntry *)0x0) {
          rc = strcmp(elem->key,local_28->next->key);
          bVar1 = 0 < rc;
        }
        if (!bVar1) break;
        local_28 = local_28->next;
      }
      if ((local_28->next == (_StdResConnTableEntry *)0x0) || (rc != 0)) {
        elem->next = local_28->next;
        local_28->next = elem;
      }
      else {
        fprintf(_stderr,
                "ERROR duplicate key: InsertInStdResConnTable(\"%s\", \"%s\") -- old(\"%s\" @%d)\n",
                elem->key,elem->value,local_28->next->value,(ulong)uVar2);
        t._4_4_ = 0;
      }
    }
  }
  return t._4_4_;
}

Assistant:

int InsertInStdResConnTable(StdResConnTableEntry_t *elem) {
   int r = 0, h = 0, rc = 1;
   StdResConnTableEntry_t *t = NULL;

   h = HashInStdResTbl(elem->key);
   t = StdResTblBucket[h];

   if (t == NULL) {           /* nothing else stored at this h value yet   */
           elem->next = NULL; /* the cdr of the new list is Z              */
      StdResTblBucket[h] = elem; /* store the element at the head of the list */
   }
   else if ((r = strcmp(elem->key, t->key)) > 0) { /* key(e) > key(t), look further down list */

      while (t->next && (r = strcmp(elem->key, t->next->key)) > 0) {
	 t = t->next;
      }

      if ((t->next == NULL) || (r != 0)) { /* hook elem in after t and before t->next */
	 elem->next = t->next;
	    t->next = elem;
      }
      else {
	 fprintf(stderr, "ERROR duplicate key: InsertInStdResConnTable(\"%s\", \"%s\") -- old(\"%s\" @%d)\n",
	       elem->key, elem->value, t->next->value, h);
	 rc = 0;
      }
   }
   else if (r < 0) {       /* the element comes ahead of the first list element */
           elem->next = t;    /* the cdr of the new list is the old list   */
      StdResTblBucket[h] = elem; /* store the element at the head of the list */
   }
   else { /* duplicate */
      fprintf(stderr, "ERROR duplicate key: InsertInStdResConnTable(\"%s\", \"%s\") - old(\"%s\" @%d)\n",
	    elem->key, elem->value, t->value, h);
      rc = 0;
   }
   return rc;
}